

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

AnalogConsumer * __thiscall
AbstractModuleClient::subscribeAnalogData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  SubType SVar1;
  network_pimpl *this_00;
  bool bVar2;
  AnalogConsumer *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined1 local_468 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  int local_430;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  HFParsingInfo local_370;
  undefined1 local_330 [144];
  SubType local_2a0;
  undefined4 uStack_29c;
  hfs_data_callback_fn p_Stack_298;
  void *pvStack_290;
  HighFreqDataType local_288;
  HighFreqDataType local_1f8;
  HighFreqDataType local_168;
  HFSubSockSettings local_d8;
  
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"analogstream","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Trodes","");
  bVar2 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_3c8,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"analogstream","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Trodes","");
    this_01 = (AnalogConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_408,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    local_330._0_8_ = local_330 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"analogstream","");
    local_468._0_8_ = local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Trodes","");
    network_pimpl::find_hfdt(&local_288,this_00,(string *)local_330,(string *)local_468);
    if ((undefined1 *)local_468._0_8_ != local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    bVar2 = HighFreqDataType::isValid(&local_288);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_388,channels);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_3a8,&local_288);
      MlmWrap::createAnalogParsingInfo
                ((HFParsingInfo *)local_468,&this->super_MlmWrap,&local_388,&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      this_01 = (AnalogConsumer *)operator_new(0x458);
      HighFreqDataType::HighFreqDataType(&local_168,&local_288);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_370.indices,(vector<int,_std::allocator<int>_> *)local_468);
      local_370.sizeOf = local_468._24_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_370.dataRequested,&local_448);
      local_370.dataLength = local_430;
      AnalogConsumer::AnalogConsumer(this_01,&local_168,(int)buffersize,&local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_370.dataRequested);
      if (local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_370.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_370.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_370.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      HighFreqDataType::~HighFreqDataType(&local_168);
      HighFreqDataType::HighFreqDataType(&local_1f8,&local_288);
      SVar1 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_330,&local_1f8);
      p_Stack_298 = (hfs_data_callback_fn)0x0;
      pvStack_290 = (void *)0x0;
      local_2a0 = SVar1;
      HighFreqDataType::~HighFreqDataType(&local_1f8);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HighFreqDataType::HighFreqDataType(&local_d8.dataType,(HighFreqDataType *)local_330);
      local_d8.args = pvStack_290;
      local_d8._148_4_ = uStack_29c;
      local_d8.subSockType = local_2a0;
      local_d8.userFoo = p_Stack_298;
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d8);
      HighFreqDataType::~HighFreqDataType(&local_d8.dataType);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_330);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_448);
      if ((pointer)local_468._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_468._0_8_,local_468._16_8_ - local_468._0_8_);
      }
    }
    else {
      this_01 = (AnalogConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_288);
  }
  return this_01;
}

Assistant:

AnalogConsumer* AbstractModuleClient::subscribeAnalogData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_ANALOG, TRODES_NETWORK_ID)){
        return (AnalogConsumer*)getHfSubObject(hfType_ANALOG, TRODES_NETWORK_ID);
    }
    HighFreqDataType dt = state->find_hfdt(hfType_ANALOG, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        // std::cerr << error("Analog data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createAnalogParsingInfo(channels, dt.getDataFormat());
    AnalogConsumer* newsub = new AnalogConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}